

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void __thiscall
gguf_writer::write_tensor_data
          (gguf_writer *this,gguf_tensor_info *info,size_t offset_data,size_t alignment)

{
  _Bool _Var1;
  size_type sVar2;
  ggml_tensor *tensor;
  gguf_writer *this_00;
  char *pcVar3;
  ggml_tensor *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t nbytes;
  size_t offset;
  
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)*in_RDI);
  if (sVar2 - in_RDX != *(long *)(in_RSI + 0x150)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0x4de,"GGML_ASSERT(%s) failed","buf.size() - offset_data == info.offset");
  }
  _Var1 = ggml_is_contiguous((ggml_tensor *)0x196818);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0x4e0,"GGML_ASSERT(%s) failed","ggml_is_contiguous(&info.t)");
  }
  tensor = (ggml_tensor *)
           std::vector<signed_char,_std::allocator<signed_char>_>::size
                     ((vector<signed_char,_std::allocator<signed_char>_> *)*in_RDI);
  this_00 = (gguf_writer *)ggml_nbytes(tensor);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_RCX,(size_type)tensor);
  if (*(long *)(in_RSI + 8) == 0) {
    if (*(long *)(in_RSI + 0xf8) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
                 ,0x4e8,"GGML_ASSERT(%s) failed","info.t.data");
    }
    pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x1968f5);
    memcpy(pcVar3 + (long)tensor,*(void **)(in_RSI + 0xf8),(size_t)this_00);
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::data
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x19689b);
    ggml_backend_tensor_get(in_RCX,tensor,(size_t)this_00,(size_t)in_RDI);
  }
  pad(this_00,(size_t)in_RDI);
  return;
}

Assistant:

void write_tensor_data(const struct gguf_tensor_info & info, const size_t offset_data, const size_t alignment) const {
        GGML_ASSERT(buf.size() - offset_data == info.offset);

        GGML_ASSERT(ggml_is_contiguous(&info.t));
        const size_t offset = buf.size();
        const size_t nbytes = ggml_nbytes(&info.t);

        buf.resize(offset + nbytes);
        if (info.t.buffer) {
            ggml_backend_tensor_get(&info.t, buf.data() + offset, 0, nbytes);
        } else {
            GGML_ASSERT(info.t.data);
            memcpy(buf.data() + offset, info.t.data, nbytes);
        }

        pad(alignment);
    }